

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O0

void re2::TestQuoteMeta(string *unquoted,Options *options)

{
  bool bVar1;
  ostream *poVar2;
  LogMessage local_2d8;
  StringPiece local_158 [2];
  StringPiece local_138;
  undefined1 local_128 [8];
  RE2 re;
  undefined1 local_38 [8];
  string quoted;
  Options *options_local;
  string *unquoted_local;
  
  StringPiece::StringPiece((StringPiece *)&re.named_groups_once_,unquoted);
  RE2::QuoteMeta_abi_cxx11_((RE2 *)local_38,(StringPiece *)&re.named_groups_once_);
  StringPiece::StringPiece(&local_138,(string *)local_38);
  RE2::RE2((RE2 *)local_128,&local_138,options);
  StringPiece::StringPiece(local_158,unquoted);
  bVar1 = RE2::FullMatch<>(local_158,(RE2 *)local_128);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_2d8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x185);
    poVar2 = LogMessage::stream(&local_2d8);
    poVar2 = std::operator<<(poVar2,"Check failed: RE2::FullMatch(unquoted, re)");
    poVar2 = std::operator<<(poVar2,"Unquoted=\'");
    poVar2 = std::operator<<(poVar2,(string *)unquoted);
    poVar2 = std::operator<<(poVar2,"\', quoted=\'");
    poVar2 = std::operator<<(poVar2,(string *)local_38);
    std::operator<<(poVar2,"\'.");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2d8);
  }
  RE2::~RE2((RE2 *)local_128);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

static void TestQuoteMeta(string unquoted,
                          const RE2::Options& options = RE2::DefaultOptions) {
  string quoted = RE2::QuoteMeta(unquoted);
  RE2 re(quoted, options);
  EXPECT_TRUE(RE2::FullMatch(unquoted, re))
      << "Unquoted='" << unquoted << "', quoted='" << quoted << "'.";
}